

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowAggStep(Parse *pParse,Window *pMWin,int csr,int bInverse,int reg)

{
  ExprList *pEVar1;
  FuncDef *p;
  int p3;
  byte bVar2;
  int iVar3;
  int iVar4;
  Vdbe *p_00;
  CollSeq *zP4;
  int p2;
  Op *pOVar5;
  Window *pWVar6;
  int iVar7;
  
  p_00 = sqlite3GetVdbe(pParse);
  if (pMWin != (Window *)0x0) {
    pWVar6 = pMWin;
    do {
      pEVar1 = (pWVar6->pOwner->x).pList;
      iVar3 = 0;
      if (pEVar1 != (ExprList *)0x0) {
        iVar3 = pEVar1->nExpr;
      }
      p = pWVar6->pFunc;
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          if ((iVar7 == 1) && (p->zName == "nth_value")) {
            iVar4 = pMWin->iEphCsr;
            p2 = pWVar6->iArgCol + 1;
            p3 = reg + 1;
          }
          else {
            p2 = pWVar6->iArgCol + iVar7;
            iVar4 = csr;
            p3 = reg + iVar7;
          }
          sqlite3VdbeAddOp3(p_00,0x5a,iVar4,p2,p3);
          iVar7 = iVar7 + 1;
        } while (iVar3 != iVar7);
      }
      if (((pMWin->regStartRowid == 0) && ((p->funcFlags & 0x1000) != 0)) && (pWVar6->eStart != 'W')
         ) {
        iVar7 = sqlite3VdbeAddOp3(p_00,0x32,reg,0,0);
        if (bInverse == 0) {
          sqlite3VdbeAddOp3(p_00,0x53,pWVar6->regApp + 1,1,0);
          sqlite3VdbeAddOp3(p_00,0x4f,reg,pWVar6->regApp,0);
          sqlite3VdbeAddOp3(p_00,0x5c,pWVar6->regApp,2,pWVar6->regApp + 2);
          sqlite3VdbeAddOp3(p_00,0x84,pWVar6->csrApp,pWVar6->regApp + 2,0);
        }
        else {
          iVar3 = sqlite3VdbeAddOp3(p_00,0x18,pWVar6->csrApp,0,reg);
          if (p_00->db->mallocFailed == '\0') {
            pOVar5 = p_00->aOp;
            pOVar5[iVar3].p4type = -3;
            pOVar5[iVar3].p4.i = 1;
          }
          sqlite3VdbeAddOp3(p_00,0x7b,pWVar6->csrApp,0,0);
          iVar3 = p_00->nOp;
          pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p_00->db->mallocFailed == '\0') {
            pOVar5 = p_00->aOp + (int)((iVar3 < 2 | 0xfffffffe) + iVar3);
          }
          pOVar5->p2 = iVar3;
        }
        iVar4 = p_00->nOp;
        pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p_00->db->mallocFailed == '\0') {
          iVar3 = iVar4 + -1;
          if (-1 < iVar7) {
            iVar3 = iVar7;
          }
LAB_00190f07:
          pOVar5 = p_00->aOp + iVar3;
        }
LAB_00190f19:
        pOVar5->p2 = iVar4;
      }
      else if (pWVar6->regApp == 0) {
        if (p->xSFunc != noopStepFunc) {
          if (pWVar6->pFilter == (Expr *)0x0) {
            iVar7 = 0;
          }
          else {
            if (pParse->nTempReg == '\0') {
              iVar4 = pParse->nMem + 1;
              pParse->nMem = iVar4;
            }
            else {
              bVar2 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar2;
              iVar4 = pParse->aTempReg[bVar2];
            }
            sqlite3VdbeAddOp3(p_00,0x5a,csr,pWVar6->iArgCol + iVar3,iVar4);
            iVar7 = sqlite3VdbeAddOp3(p_00,0x14,iVar4,0,1);
            if (iVar4 != 0) {
              bVar2 = pParse->nTempReg;
              if ((ulong)bVar2 < 8) {
                pParse->nTempReg = bVar2 + 1;
                pParse->aTempReg[bVar2] = iVar4;
              }
            }
          }
          if ((p->funcFlags & 0x20) != 0) {
            zP4 = sqlite3ExprCollSeq(pParse,((pWVar6->pOwner->x).pList)->a[0].pExpr);
            if (zP4 == (CollSeq *)0x0) {
              zP4 = pParse->db->pDfltColl;
            }
            iVar4 = sqlite3VdbeAddOp3(p_00,0x52,0,0,0);
            sqlite3VdbeChangeP4(p_00,iVar4,(char *)zP4,-2);
          }
          sqlite3VdbeAddOp3(p_00,(bInverse == 0) + 0x99,bInverse,reg,pWVar6->regAccum);
          if (p_00->db->mallocFailed == '\0') {
            pOVar5 = p_00->aOp;
            iVar4 = p_00->nOp;
            pOVar5[(long)iVar4 + -1].p4type = -8;
            pOVar5[(long)iVar4 + -1].p4.pKeyInfo = (KeyInfo *)p;
          }
          else if ((p->funcFlags & 0x10) != 0) {
            sqlite3DbFreeNN(p_00->db,p);
          }
          iVar4 = p_00->nOp;
          if (0 < (long)iVar4) {
            p_00->aOp[(long)iVar4 + -1].p5 = (ushort)iVar3 & 0xff;
          }
          if (iVar7 != 0) {
            pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p_00->db->mallocFailed == '\0') {
              iVar3 = iVar4 + -1;
              if (-1 < iVar7) {
                iVar3 = iVar7;
              }
              goto LAB_00190f07;
            }
            goto LAB_00190f19;
          }
        }
      }
      else {
        sqlite3VdbeAddOp3(p_00,0x53,(pWVar6->regApp - bInverse) + 1,1,0);
      }
      pWVar6 = pWVar6->pNextWin;
    } while (pWVar6 != (Window *)0x0);
  }
  return;
}

Assistant:

static void windowAggStep(
  Parse *pParse, 
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    int regArg;
    int nArg = windowArgCount(pWin);
    int i;

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      int addrIf = 0;
      if( pWin->pFilter ){
        int regTmp;
        assert( nArg==0 || nArg==pWin->pOwner->x.pList->nExpr );
        assert( nArg || pWin->pOwner->x.pList==0 );
        regTmp = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
        addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, regTmp);
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep, 
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nArg);
      if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
    }
  }
}